

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_net_cleanup(oonf_layer2_net *l2net,oonf_layer2_origin *origin,_Bool cleanup_neigh)

{
  list_entity *plVar1;
  _Bool _Var2;
  _Bool _Var3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int i;
  _Bool changed;
  oonf_layer2_neigh *l2neigh;
  _Bool cleanup_neigh_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_net *l2net_local;
  
  _Var3 = false;
  for (__tempptr._0_4_ = 0; (int)__tempptr < 0x10; __tempptr._0_4_ = (int)__tempptr + 1) {
    if (l2net->data[(int)__tempptr]._origin == origin) {
      l2net->data[(int)__tempptr]._meta = (oonf_layer2_metadata *)0x0;
      l2net->data[(int)__tempptr]._origin = (oonf_layer2_origin *)0x0;
      _Var3 = true;
    }
  }
  for (__tempptr._0_4_ = 0; (int)__tempptr < 0x1a; __tempptr._0_4_ = (int)__tempptr + 1) {
    if (l2net->neighdata[(int)__tempptr]._origin == origin) {
      l2net->neighdata[(int)__tempptr]._meta = (oonf_layer2_metadata *)0x0;
      l2net->neighdata[(int)__tempptr]._origin = (oonf_layer2_origin *)0x0;
      _Var3 = true;
    }
  }
  if (cleanup_neigh) {
    for (plVar1 = (l2net->neighbors).list_head.next; _i = (oonf_layer2_neigh *)(plVar1 + -0x4c),
        plVar1->prev != (l2net->neighbors).list_head.prev; plVar1 = plVar1->next) {
      _Var2 = oonf_layer2_neigh_cleanup(_i,origin);
      _Var3 = _Var3 != false || _Var2;
    }
  }
  return _Var3;
}

Assistant:

bool
oonf_layer2_net_cleanup(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin, bool cleanup_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  bool changed = false;
  int i;

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (l2net->data[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->data[i]);
      changed = true;
    }
  }
  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (l2net->neighdata[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->neighdata[i]);
      changed = true;
    }
  }

  if (cleanup_neigh) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      changed |= oonf_layer2_neigh_cleanup(l2neigh, origin);
    }
  }
  return changed;
}